

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::sprintf_abi_cxx11_(char *__s,char *__format,...)

{
  uint64_t in_RCX;
  BasicCStringRef<char> in_RDX;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ArgList args;
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> local_230;
  
  local_230.super_BasicWriter<char>.buffer_ = &local_230.buffer_.super_Buffer<char>;
  local_230.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
  local_230.buffer_.super_Buffer<char>.ptr_ = local_230.buffer_.data_;
  local_230.buffer_.super_Buffer<char>.size_ = 0;
  local_230.buffer_.super_Buffer<char>.capacity_ = 500;
  local_230.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
  args.field_1.args_ = in_R8.args_;
  args.types_ = in_RCX;
  printf<char>((fmt *)&local_230,(BasicWriter<char> *)__format,in_RDX,args);
  BasicWriter<char>::str_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__s,
             &local_230.super_BasicWriter<char>);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_230);
  return (int)__s;
}

Assistant:

inline std::string sprintf(CStringRef format, ArgList args) {
  MemoryWriter w;
  printf(w, format, args);
  return w.str();
}